

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initTranslationFiles(VcprojGenerator *this)

{
  VCFilter *this_00;
  QMakeProject *pQVar1;
  ProStringList *pPVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QAnyStringView QVar5;
  ProKey local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->vcProject).TranslationFiles;
  QVar3.m_size = (size_t)"Translation Files";
  QVar3.field_0.m_data = this_00;
  QString::assign(QVar3);
  (this->vcProject).TranslationFiles.ParseFiles = _False;
  QVar4.m_size = (size_t)"ts;xlf";
  QVar4.field_0.m_data = &(this->vcProject).TranslationFiles.Filter;
  QString::assign(QVar4);
  QVar5.m_size = (size_t)"{639EADAA-A684-42e4-A9AD-28FC9BCB8F7C}";
  QVar5.field_0.m_data = &(this->vcProject).TranslationFiles.Guid;
  QString::assign(QVar5);
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,"TRANSLATIONS");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_58);
  VCFilter::addFiles(this_00,pPVar2);
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,"EXTRA_TRANSLATIONS");
  pPVar2 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,&local_58);
  VCFilter::addFiles(this_00,pPVar2);
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  (this->vcProject).TranslationFiles.Project = this;
  (this->vcProject).TranslationFiles.Config = &(this->vcProject).Configuration;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initTranslationFiles()
{
    vcProject.TranslationFiles.Name = "Translation Files";
    vcProject.TranslationFiles.ParseFiles = _False;
    vcProject.TranslationFiles.Filter = "ts;xlf";
    vcProject.TranslationFiles.Guid = _GUIDTranslationFiles;

    vcProject.TranslationFiles.addFiles(project->values("TRANSLATIONS"));
    vcProject.TranslationFiles.addFiles(project->values("EXTRA_TRANSLATIONS"));

    vcProject.TranslationFiles.Project = this;
    vcProject.TranslationFiles.Config = &(vcProject.Configuration);
}